

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator-(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  pointer pBVar4;
  double dVar5;
  bool local_f1;
  Blade local_c8;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_c0;
  Blade *local_b8;
  Blade local_b0;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_a8;
  Blade *local_a0;
  Blade *local_98;
  Blade local_8c;
  float local_84;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> _Stack_80;
  float Val;
  Blade local_78;
  Blade *local_70;
  Blade local_54;
  int local_4c;
  iterator iStack_48;
  int d;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_40;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_38;
  idx b;
  idx a;
  Clifford *B_local;
  Clifford *A_local;
  Clifford *C;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
  b._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(A);
  local_38._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(B);
  while( true ) {
    local_40._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::end(A);
    bVar3 = __gnu_cxx::operator!=(&b,&local_40);
    local_f1 = false;
    if (bVar3) {
      iStack_48 = std::vector<Blade,_std::allocator<Blade>_>::end(B);
      local_f1 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffb8);
    }
    if (local_f1 == false) break;
    pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&b);
    iVar2 = pBVar4->mBase;
    pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&local_38);
    local_4c = iVar2 - pBVar4->mBase;
    if (local_4c < 0) {
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&b);
      iVar2 = pBVar4->mBase;
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&b);
      Blade::Blade(&local_54,iVar2,pBVar4->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_54);
      Blade::~Blade(&local_54);
      local_70 = (Blade *)__gnu_cxx::
                          __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                          operator++(&b,0);
    }
    else if (local_4c < 1) {
      if (local_4c == 0) {
        pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                 ::operator->(&b);
        fVar1 = pBVar4->mVal;
        pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                 ::operator->(&local_38);
        local_84 = fVar1 - pBVar4->mVal;
        dVar5 = std::fabs((double)(ulong)(uint)local_84);
        if (1e-06 < SUB84(dVar5,0)) {
          pBVar4 = __gnu_cxx::
                   __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                   operator->(&b);
          Blade::Blade(&local_8c,pBVar4->mBase,local_84);
          std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_8c);
          Blade::~Blade(&local_8c);
        }
        local_98 = (Blade *)__gnu_cxx::
                            __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                            ::operator++(&b,0);
        local_a0 = (Blade *)__gnu_cxx::
                            __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                            ::operator++(&local_38,0);
      }
    }
    else {
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_38);
      iVar2 = pBVar4->mBase;
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_38);
      Blade::Blade(&local_78,iVar2,-pBVar4->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_78);
      Blade::~Blade(&local_78);
      _Stack_80 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                  ::operator++(&local_38,0);
    }
  }
  while( true ) {
    local_a8._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::end(B);
    bVar3 = __gnu_cxx::operator!=(&local_38,&local_a8);
    if (!bVar3) break;
    pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&local_38);
    dVar5 = std::fabs((double)(ulong)(uint)pBVar4->mVal);
    if (1e-06 < SUB84(dVar5,0)) {
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_38);
      iVar2 = pBVar4->mBase;
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_38);
      Blade::Blade(&local_b0,iVar2,-pBVar4->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_b0);
      Blade::~Blade(&local_b0);
    }
    local_b8 = (Blade *)__gnu_cxx::
                        __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                        operator++(&local_38,0);
  }
  while( true ) {
    local_c0._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::end(A);
    bVar3 = __gnu_cxx::operator!=(&b,&local_c0);
    if (!bVar3) break;
    pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&b);
    dVar5 = std::fabs((double)(ulong)(uint)pBVar4->mVal);
    if (1e-06 < SUB84(dVar5,0)) {
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&b);
      iVar2 = pBVar4->mBase;
      pBVar4 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&b);
      Blade::Blade(&local_c8,iVar2,pBVar4->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_c8);
      Blade::~Blade(&local_c8);
    }
    __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::operator++
              (&b,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator-(Clifford A, Clifford B) {
	Clifford C; 
	idx a=A.begin();
	idx b=B.begin();
	while(a!=A.end()&&b!=B.end())
	{
		//switch
		int d=(a->mBase)-(b->mBase);
		if(d<0)
		{C.push_back(Blade(a->mBase,a->mVal));a++;}
		else if(d>0)
		{C.push_back(Blade(b->mBase,-b->mVal));b++;}
		else if(0==d)
		{
			float Val=a->mVal-b->mVal;
			if(fabs(Val)>Error2){C.push_back(Blade(a->mBase,Val));}
			a++;b++;
		}
	}
	while(b!=B.end())
	{	
		if(fabs(b->mVal)>Error2){C.push_back(Blade(b->mBase,-b->mVal));}
		b++;
	}
	while(a!=A.end())
	{	
		if(fabs(a->mVal)>Error2){C.push_back(Blade(a->mBase,a->mVal));}
		a++;
	}
  return C;
}